

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<kj::Maybe<int>_> __thiscall capnp::Capability::Client::getFd(Client *this)

{
  bool bVar1;
  ClientHook *pCVar2;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *other;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pPVar3;
  Own<capnp::ClientHook,_std::nullptr_t> *attachments;
  Own<capnp::ClientHook,_std::nullptr_t> *in_RSI;
  Maybe<int> local_8c;
  Own<capnp::ClientHook,_std::nullptr_t> local_80;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_70;
  Own<capnp::ClientHook,_std::nullptr_t> *local_68;
  Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *promise;
  undefined1 local_50 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise75;
  Maybe<int> local_20;
  Maybe<int> fd;
  Client *this_local;
  
  pCVar2 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(in_RSI);
  (*pCVar2->_vptr_ClientHook[5])();
  bVar1 = kj::Maybe<int>::operator==(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pCVar2 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(in_RSI);
    (*pCVar2->_vptr_ClientHook[3])(&promise);
    other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>>
                      ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&promise)
    ;
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_50,
               other);
    kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~Maybe
              ((Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&promise);
    pPVar3 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_50);
    if (pPVar3 == (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
      kj::Maybe<int>::Maybe(&local_8c);
      kj::Promise<kj::Maybe<int>_>::Promise((Promise<kj::Maybe<int>_> *)this,&local_8c);
      kj::Maybe<int>::~Maybe(&local_8c);
    }
    else {
      attachments = (Own<capnp::ClientHook,_std::nullptr_t> *)
                    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
                    ::operator*((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
                                 *)local_50);
      local_68 = attachments;
      pCVar2 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(in_RSI);
      (*pCVar2->_vptr_ClientHook[4])(&local_80);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_70,attachments);
      kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
      then<capnp::Capability::Client::getFd()::__0>
                ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)this,(Type *)&local_70);
      kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Promise(&local_70);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_80);
    }
    _promise75.field_1._0_4_ = 1;
    kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
              ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)local_50)
    ;
  }
  else {
    kj::Maybe<int>::Maybe
              ((Maybe<int> *)((long)&_promise75.field_1.value.super_PromiseBase.node.ptr + 4),
               &local_20);
    kj::Promise<kj::Maybe<int>_>::Promise
              ((Promise<kj::Maybe<int>_> *)this,
               (FixVoid<kj::Maybe<int>_> *)
               ((long)&_promise75.field_1.value.super_PromiseBase.node.ptr + 4));
    kj::Maybe<int>::~Maybe
              ((Maybe<int> *)((long)&_promise75.field_1.value.super_PromiseBase.node.ptr + 4));
    _promise75.field_1._0_4_ = 1;
  }
  kj::Maybe<int>::~Maybe(&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<int>> Capability::Client::getFd() {
  auto fd = hook->getFd();
  if (fd != kj::none) {
    return fd;
  } else KJ_IF_SOME(promise, hook->whenMoreResolved()) {
    return promise.attach(hook->addRef()).then([](kj::Own<ClientHook> newHook) {
      return Client(kj::mv(newHook)).getFd();
    });
  } else {
    return kj::Maybe<int>(kj::none);
  }